

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# impute.hpp
# Opt level: O0

void apply_imputation_results<PredictionData<double,unsigned_long>,ImputedData<unsigned_long,double>>
               (PredictionData<double,_unsigned_long> *prediction_data,
               ImputedData<unsigned_long,_double> *imp,Imputer *imputer,size_t row)

{
  double dVar1;
  size_type sVar2;
  bool bVar3;
  uint uVar4;
  reference pvVar5;
  reference pvVar6;
  difference_type dVar7;
  reference pvVar8;
  reference pvVar9;
  iterator __first;
  long in_RCX;
  long *in_RDX;
  vector<double,_std::allocator<double>_> *in_RSI;
  long *in_RDI;
  size_t ix_4;
  size_t ix_3;
  unsigned_long ix_2;
  size_t ix_1;
  size_t ix;
  size_t pos;
  size_t col;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffff48;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
  in_stack_ffffffffffffff58;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
  in_stack_ffffffffffffff60;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
  in_stack_ffffffffffffff68;
  pointer local_78;
  pointer local_50;
  ulong local_48;
  pointer local_40;
  pointer local_38;
  size_type local_30;
  
  local_30 = 0;
  if ((*(byte *)(in_RDI + 3) & 1) == 0) {
    for (local_40 = (pointer)0x0;
        local_40 <
        in_RSI[9].super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start; local_40 = (pointer)((long)local_40 + 1)) {
      pvVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                         ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)(in_RSI + 6),
                          (size_type)local_40);
      sVar2 = *pvVar5;
      pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                         (in_RSI + 1,(size_type)local_40);
      if (*pvVar6 <= 0.0) {
LAB_004407ce:
        pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)(in_RDX + 8),sVar2);
        *(value_type *)(*in_RDI + (sVar2 + in_RCX * *in_RDX) * 8) = *pvVar6;
      }
      else {
        pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                           (in_RSI,(size_type)local_40);
        uVar4 = std::isnan(*pvVar6);
        if ((uVar4 & 1) != 0) goto LAB_004407ce;
        pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                           (in_RSI,(size_type)local_40);
        uVar4 = std::isinf(*pvVar6);
        if ((uVar4 & 1) != 0) goto LAB_004407ce;
        pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                           (in_RSI,(size_type)local_40);
        if ((*pvVar6 == 0.0) && (!NAN(*pvVar6))) {
          pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                             ((vector<double,_std::allocator<double>_> *)(in_RDX + 8),sVar2);
          uVar4 = std::isnan(*pvVar6);
          if ((uVar4 & 1) != 0) goto LAB_004407ce;
        }
        pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                           (in_RSI,(size_type)local_40);
        in_stack_ffffffffffffff58._M_current = (double *)*pvVar6;
        pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                           (in_RSI + 1,(size_type)local_40);
        *(double *)(*in_RDI + (sVar2 + in_RCX * *in_RDX) * 8) =
             (double)in_stack_ffffffffffffff58._M_current / *pvVar6;
      }
    }
  }
  else {
    for (local_38 = (pointer)0x0;
        local_38 <
        in_RSI[9].super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start; local_38 = (pointer)((long)local_38 + 1)) {
      pvVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                         ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)(in_RSI + 6),
                          (size_type)local_38);
      sVar2 = *pvVar5;
      pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                         (in_RSI + 1,(size_type)local_38);
      if (*pvVar6 <= 0.0) {
LAB_004405f9:
        pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)(in_RDX + 8),sVar2);
        *(value_type *)(*in_RDI + (in_RCX + sVar2 * in_RDI[2]) * 8) = *pvVar6;
      }
      else {
        pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                           (in_RSI,(size_type)local_38);
        uVar4 = std::isnan(*pvVar6);
        if ((uVar4 & 1) != 0) goto LAB_004405f9;
        pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                           (in_RSI,(size_type)local_38);
        uVar4 = std::isinf(*pvVar6);
        if ((uVar4 & 1) != 0) goto LAB_004405f9;
        pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                           (in_RSI,(size_type)local_38);
        if ((*pvVar6 == 0.0) && (!NAN(*pvVar6))) {
          pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                             ((vector<double,_std::allocator<double>_> *)(in_RDX + 8),sVar2);
          uVar4 = std::isnan(*pvVar6);
          if ((uVar4 & 1) != 0) goto LAB_004405f9;
        }
        pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                           (in_RSI,(size_type)local_38);
        in_stack_ffffffffffffff60._M_current = (double *)*pvVar6;
        pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                           (in_RSI + 1,(size_type)local_38);
        *(double *)(*in_RDI + (in_RCX + sVar2 * in_RDI[2]) * 8) =
             (double)in_stack_ffffffffffffff60._M_current / *pvVar6;
      }
    }
  }
  if (in_RDI[9] != 0) {
    for (local_48 = *(ulong *)(in_RDI[0xb] + in_RCX * 8);
        local_48 < *(ulong *)(in_RDI[0xb] + 8 + in_RCX * 8); local_48 = local_48 + 1) {
      uVar4 = std::isnan(*(double *)(in_RDI[9] + local_48 * 8));
      if (((uVar4 & 1) != 0) ||
         (uVar4 = std::isinf(*(double *)(in_RDI[9] + local_48 * 8)), (uVar4 & 1) != 0)) {
        pvVar6 = std::vector<double,_std::allocator<double>_>::operator[](in_RSI + 5,local_30);
        if (*pvVar6 <= 0.0) {
LAB_004409a0:
          in_stack_ffffffffffffff48 = (vector<double,_std::allocator<double>_> *)(in_RDX + 8);
          pvVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                             ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)(in_RSI + 8),
                              local_30);
          pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                             (in_stack_ffffffffffffff48,*pvVar5);
          *(value_type *)(in_RDI[9] + local_48 * 8) = *pvVar6;
        }
        else {
          pvVar6 = std::vector<double,_std::allocator<double>_>::operator[](in_RSI + 4,local_30);
          uVar4 = std::isnan(*pvVar6);
          if ((uVar4 & 1) != 0) goto LAB_004409a0;
          pvVar6 = std::vector<double,_std::allocator<double>_>::operator[](in_RSI + 4,local_30);
          uVar4 = std::isinf(*pvVar6);
          if ((uVar4 & 1) != 0) goto LAB_004409a0;
          pvVar6 = std::vector<double,_std::allocator<double>_>::operator[](in_RSI + 4,local_30);
          dVar1 = *pvVar6;
          pvVar6 = std::vector<double,_std::allocator<double>_>::operator[](in_RSI + 5,local_30);
          *(double *)(in_RDI[9] + local_48 * 8) = dVar1 / *pvVar6;
        }
        local_30 = local_30 + 1;
      }
    }
  }
  if ((*(byte *)(in_RDI + 3) & 1) == 0) {
    for (local_78 = (pointer)0x0;
        local_78 <
        in_RSI[9].super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_finish; local_78 = (pointer)((long)local_78 + 1)) {
      pvVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                         ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)(in_RSI + 7),
                          (size_type)local_78);
      sVar2 = *pvVar5;
      std::
      vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ::operator[]((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                    *)(in_RSI + 2),sVar2);
      std::vector<double,_std::allocator<double>_>::begin(in_stack_ffffffffffffff48);
      std::
      vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ::operator[]((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                    *)(in_RSI + 2),sVar2);
      std::vector<double,_std::allocator<double>_>::begin(in_stack_ffffffffffffff48);
      std::
      vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ::operator[]((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                    *)(in_RSI + 2),sVar2);
      __first = std::vector<double,_std::allocator<double>_>::end(in_stack_ffffffffffffff48);
      std::
      max_element<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>>
                ((__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>)
                 __first._M_current,in_stack_ffffffffffffff60);
      dVar7 = std::
              distance<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>>
                        (in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
      *(int *)(in_RDI[1] + (sVar2 + in_RCX * in_RDX[1]) * 4) = (int)dVar7;
      if (*(int *)(in_RDI[1] + (sVar2 + in_RCX * in_RDX[1]) * 4) == 0) {
        bVar3 = std::
                vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                ::empty((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                         *)in_stack_ffffffffffffff60._M_current);
        if (!bVar3) {
          std::
          vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
          ::operator[]((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                        *)(in_RSI + 2),sVar2);
          bVar3 = std::vector<double,_std::allocator<double>_>::empty
                            ((vector<double,_std::allocator<double>_> *)
                             in_stack_ffffffffffffff60._M_current);
          if (!bVar3) {
            pvVar8 = std::
                     vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                     ::operator[]((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                   *)(in_RSI + 2),sVar2);
            pvVar6 = std::vector<double,_std::allocator<double>_>::operator[](pvVar8,0);
            if (*pvVar6 <= 0.0) {
              pvVar9 = std::vector<int,_std::allocator<int>_>::operator[]
                                 ((vector<int,_std::allocator<int>_> *)(in_RDX + 0xb),sVar2);
              *(value_type *)(in_RDI[1] + (sVar2 + in_RCX * in_RDX[1]) * 4) = *pvVar9;
            }
            goto LAB_00440ea9;
          }
        }
        *(undefined4 *)(in_RDI[1] + (sVar2 + in_RCX * in_RDX[1]) * 4) = 0xffffffff;
      }
LAB_00440ea9:
    }
  }
  else {
    for (local_50 = (pointer)0x0;
        local_50 <
        in_RSI[9].super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_finish; local_50 = (pointer)((long)local_50 + 1)) {
      pvVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                         ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)(in_RSI + 7),
                          (size_type)local_50);
      sVar2 = *pvVar5;
      std::
      vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ::operator[]((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                    *)(in_RSI + 2),sVar2);
      std::vector<double,_std::allocator<double>_>::begin(in_stack_ffffffffffffff48);
      std::
      vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ::operator[]((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                    *)(in_RSI + 2),sVar2);
      std::vector<double,_std::allocator<double>_>::begin(in_stack_ffffffffffffff48);
      std::
      vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ::operator[]((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                    *)(in_RSI + 2),sVar2);
      std::vector<double,_std::allocator<double>_>::end(in_stack_ffffffffffffff48);
      std::
      max_element<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>>
                (in_stack_ffffffffffffff68,in_stack_ffffffffffffff60);
      dVar7 = std::
              distance<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>>
                        (in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
      *(int *)(in_RDI[1] + (in_RCX + sVar2 * in_RDI[2]) * 4) = (int)dVar7;
      if (*(int *)(in_RDI[1] + (in_RCX + sVar2 * in_RDI[2]) * 4) == 0) {
        bVar3 = std::
                vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                ::empty((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                         *)in_stack_ffffffffffffff60._M_current);
        if (!bVar3) {
          std::
          vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
          ::operator[]((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                        *)(in_RSI + 2),sVar2);
          bVar3 = std::vector<double,_std::allocator<double>_>::empty
                            ((vector<double,_std::allocator<double>_> *)
                             in_stack_ffffffffffffff60._M_current);
          if (!bVar3) {
            pvVar8 = std::
                     vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                     ::operator[]((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                   *)(in_RSI + 2),sVar2);
            pvVar6 = std::vector<double,_std::allocator<double>_>::operator[](pvVar8,0);
            if (*pvVar6 <= 0.0) {
              pvVar9 = std::vector<int,_std::allocator<int>_>::operator[]
                                 ((vector<int,_std::allocator<int>_> *)(in_RDX + 0xb),sVar2);
              *(value_type *)(in_RDI[1] + (in_RCX + sVar2 * in_RDI[2]) * 4) = *pvVar9;
            }
            goto LAB_00440c5f;
          }
        }
        *(undefined4 *)(in_RDI[1] + (in_RCX + sVar2 * in_RDI[2]) * 4) = 0xffffffff;
      }
LAB_00440c5f:
    }
  }
  return;
}

Assistant:

void apply_imputation_results(PredictionData  &prediction_data,
                              ImputedData     &imp,
                              Imputer         &imputer,
                              size_t          row)
{
    size_t col;
    size_t pos = 0;
    if (prediction_data.is_col_major)
    {
        for (size_t ix = 0; ix < imp.n_missing_num; ix++)
        {
            col = imp.missing_num[ix];
            if (imp.num_weight[ix] > 0 && !is_na_or_inf(imp.num_sum[ix]) && !(imp.num_sum[ix] == 0 && std::isnan(imputer.col_means[col])))
                prediction_data.numeric_data[row + col * prediction_data.nrows]
                    =
                imp.num_sum[ix] / imp.num_weight[ix];
            else
                prediction_data.numeric_data[row + col * prediction_data.nrows]
                    =
                imputer.col_means[col];
        }
    }

    else
    {
        for (size_t ix = 0; ix < imp.n_missing_num; ix++)
        {
            col = imp.missing_num[ix];
            if (imp.num_weight[ix] > 0 && !is_na_or_inf(imp.num_sum[ix]) && !(imp.num_sum[ix] == 0 && std::isnan(imputer.col_means[col])))
                prediction_data.numeric_data[col + row * imputer.ncols_numeric]
                    =
                imp.num_sum[ix] / imp.num_weight[ix];
            else
                prediction_data.numeric_data[col + row * imputer.ncols_numeric]
                    =
                imputer.col_means[col];
        }
    }

    if (prediction_data.Xr != NULL)
        for (auto ix = prediction_data.Xr_indptr[row]; ix < prediction_data.Xr_indptr[row + 1]; ix++)
        {
            if (is_na_or_inf(prediction_data.Xr[ix]))
            {
                if (imp.sp_num_weight[pos] > 0 && !is_na_or_inf(imp.sp_num_sum[pos]))
                    prediction_data.Xr[ix]
                        =
                    imp.sp_num_sum[pos] / imp.sp_num_weight[pos];
                else
                    prediction_data.Xr[ix]
                        =
                    imputer.col_means[imp.missing_sp[pos]];
                pos++;
            }
        }

    if (prediction_data.is_col_major)
    {
        for (size_t ix = 0; ix < imp.n_missing_cat; ix++)
        {
            col = imp.missing_cat[ix];
            prediction_data.categ_data[row + col * prediction_data.nrows]
                        =
            std::distance(imp.cat_sum[col].begin(),
                          std::max_element(imp.cat_sum[col].begin(), imp.cat_sum[col].end()));

            if (prediction_data.categ_data[row + col * prediction_data.nrows] == 0)
            {
                if (imp.cat_sum.empty() || imp.cat_sum[col].empty())
                {
                    prediction_data.categ_data[row + col * prediction_data.nrows] = -1;
                }

                else if (imp.cat_sum[col][0] <= 0)
                {
                    prediction_data.categ_data[row + col * prediction_data.nrows]
                        =
                    imputer.col_modes[col];
                }
            }
        }
    }

    else
    {
        for (size_t ix = 0; ix < imp.n_missing_cat; ix++)
        {
            col = imp.missing_cat[ix];
            prediction_data.categ_data[col + row * imputer.ncols_categ]
                        =
            std::distance(imp.cat_sum[col].begin(),
                          std::max_element(imp.cat_sum[col].begin(), imp.cat_sum[col].end()));

            if (prediction_data.categ_data[col + row * imputer.ncols_categ] == 0)
            {
                if (imp.cat_sum.empty() || imp.cat_sum[col].empty())
                {
                    prediction_data.categ_data[col + row * imputer.ncols_categ] = -1;
                }
                
                else if (imp.cat_sum[col][0] <= 0)
                {
                    prediction_data.categ_data[col + row * imputer.ncols_categ]
                        =
                    imputer.col_modes[col];
                }
            }
        }
    }
}